

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printMessage(AssertionPrinter *this)

{
  bool bVar1;
  ulong uVar2;
  ostream *poVar3;
  pointer pMVar4;
  TextAttributes *_attr;
  TextAttributes local_88;
  Text local_70;
  __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
  local_20;
  const_iterator itEnd;
  const_iterator it;
  AssertionPrinter *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    poVar3 = std::operator<<(this->stream,(string *)&this->messageLabel);
    poVar3 = std::operator<<(poVar3,':');
    std::operator<<(poVar3,'\n');
  }
  itEnd = std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::begin
                    (&this->messages);
  local_20._M_current =
       (MessageInfo *)
       std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::end(&this->messages);
  do {
    bVar1 = __gnu_cxx::operator!=(&itEnd,&local_20);
    if (!bVar1) {
      return;
    }
    if ((this->printInfoMessages & 1U) == 0) {
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&itEnd);
      if (pMVar4->type != Info) goto LAB_0018c5ab;
    }
    else {
LAB_0018c5ab:
      poVar3 = this->stream;
      pMVar4 = __gnu_cxx::
               __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
               ::operator->(&itEnd);
      Tbc::TextAttributes::TextAttributes(&local_88);
      _attr = Tbc::TextAttributes::setIndent(&local_88,2);
      Tbc::Text::Text(&local_70,&pMVar4->message,_attr);
      poVar3 = Tbc::operator<<(poVar3,&local_70);
      std::operator<<(poVar3,'\n');
      Tbc::Text::~Text(&local_70);
    }
    __gnu_cxx::
    __normal_iterator<const_Catch::MessageInfo_*,_std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>_>
    ::operator++(&itEnd);
  } while( true );
}

Assistant:

void printMessage() const {
                if( !messageLabel.empty() )
                    stream << messageLabel << ':' << '\n';
                for( std::vector<MessageInfo>::const_iterator it = messages.begin(), itEnd = messages.end();
                        it != itEnd;
                        ++it ) {
                    // If this assertion is a warning ignore any INFO messages
                    if( printInfoMessages || it->type != ResultWas::Info )
                        stream << Text( it->message, TextAttributes().setIndent(2) ) << '\n';
                }
            }